

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O2

void appendNonbasicColsToBasis(HighsLp *lp,SimplexBasis *basis,HighsInt XnumNewCol)

{
  long lVar1;
  vector<signed_char,_std::allocator<signed_char>_> *this;
  vector<signed_char,_std::allocator<signed_char>_> *this_00;
  double dVar2;
  double val;
  int iVar3;
  pointer piVar4;
  pointer pcVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  long lVar9;
  long lVar10;
  size_type __new_size;
  int iVar11;
  
  if (XnumNewCol != 0) {
    iVar3 = lp->num_col_;
    lVar1 = (long)iVar3 + (long)XnumNewCol;
    __new_size = (long)(int)lVar1 + (long)lp->num_row_;
    this = &basis->nonbasicFlag_;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize(this,__new_size);
    this_00 = &basis->nonbasicMove_;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize(this_00,__new_size);
    lVar10 = (long)XnumNewCol + (long)iVar3 + -1;
    for (lVar9 = (long)lp->num_row_; 0 < lVar9; lVar9 = lVar9 + -1) {
      piVar4 = (basis->basicIndex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = piVar4[lVar9 + -1];
      iVar11 = lp->num_col_;
      if (iVar11 <= iVar3) {
        piVar4[lVar9 + -1] = iVar3 + XnumNewCol;
        iVar11 = lp->num_col_;
      }
      pcVar5 = (this->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar5[lVar9 + lVar10] = pcVar5[lVar9 + -1 + (long)iVar11];
      pcVar5 = (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar5[lVar9 + lVar10] = pcVar5[lVar9 + -1 + (long)lp->num_col_];
    }
    for (lVar9 = (long)lp->num_col_; lVar9 < lVar1; lVar9 = lVar9 + 1) {
      (this->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar9] = '\x01';
      dVar2 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar9];
      val = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9];
      if ((dVar2 != val) || (NAN(dVar2) || NAN(val))) {
        bVar6 = highs_isInfinity(-dVar2);
        bVar7 = highs_isInfinity(val);
        if (bVar6) {
          bVar8 = bVar7 - 1;
        }
        else {
          bVar8 = 1;
          if (!bVar7) {
            bVar8 = -(ABS(val) <= ABS(dVar2)) | 1;
          }
        }
      }
      else {
        bVar8 = 0;
      }
      (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar9] = bVar8;
    }
  }
  return;
}

Assistant:

void appendNonbasicColsToBasis(HighsLp& lp, SimplexBasis& basis,
                               HighsInt XnumNewCol) {
  // Add nonbasic structurals
  if (XnumNewCol == 0) return;
  HighsInt newNumCol = lp.num_col_ + XnumNewCol;
  HighsInt newNumTot = newNumCol + lp.num_row_;
  basis.nonbasicFlag_.resize(newNumTot);
  basis.nonbasicMove_.resize(newNumTot);
  // Shift the row data in basicIndex, nonbasicFlag and nonbasicMove if
  // necessary
  for (HighsInt iRow = lp.num_row_ - 1; iRow >= 0; iRow--) {
    HighsInt iCol = basis.basicIndex_[iRow];
    if (iCol >= lp.num_col_) {
      // This basic variable is a row, so shift its index
      basis.basicIndex_[iRow] += XnumNewCol;
    }
    basis.nonbasicFlag_[newNumCol + iRow] =
        basis.nonbasicFlag_[lp.num_col_ + iRow];
    basis.nonbasicMove_[newNumCol + iRow] =
        basis.nonbasicMove_[lp.num_col_ + iRow];
  }
  // Make any new columns nonbasic
  for (HighsInt iCol = lp.num_col_; iCol < newNumCol; iCol++) {
    basis.nonbasicFlag_[iCol] = kNonbasicFlagTrue;
    double lower = lp.col_lower_[iCol];
    double upper = lp.col_upper_[iCol];
    int8_t move = kIllegalMoveValue;
    if (lower == upper) {
      // Fixed
      move = kNonbasicMoveZe;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        if (fabs(lower) < fabs(upper)) {
          move = kNonbasicMoveUp;
        } else {
          move = kNonbasicMoveDn;
        }
      } else {
        // Lower (since upper bound is infinite)
        move = kNonbasicMoveUp;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      move = kNonbasicMoveDn;
    } else {
      // FREE
      move = kNonbasicMoveZe;
    }
    assert(move != kIllegalMoveValue);
    basis.nonbasicMove_[iCol] = move;
  }
}